

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EfiTianoCompressLegacy.c
# Opt level: O2

void MakeChild(NODE_conflict Parent,UINT8 CharC,NODE_conflict Child)

{
  int iVar1;
  NODE_conflict *pNVar2;
  int iVar3;
  undefined7 in_register_00000031;
  
  pNVar2 = mNext;
  iVar3 = Parent + (int)CONCAT71(in_register_00000031,CharC) * 0x400 + 0x100000;
  iVar1 = mNext[iVar3];
  mNext[iVar3] = Child;
  pNVar2[Child] = iVar1;
  pNVar2 = mPrev;
  mPrev[iVar1] = Child;
  pNVar2[Child] = iVar3;
  mParent[Child] = Parent;
  mChildCount[Parent] = mChildCount[Parent] + '\x01';
  return;
}

Assistant:

STATIC
  VOID
  MakeChild (
  NODE  Parent,
  UINT8 CharC,
  NODE  Child
  )
  /*++

  Routine Description:

  Create a new child for a given parent node.

  Arguments:

  Parent       - the parent node
  CharC   - the edge character
  Child       - the child node

  Returns: (VOID)

  --*/
{
  NODE  Node1;
  NODE  Node2;

  Node1           = (NODE) HASH (Parent, CharC);
  Node2           = mNext[Node1];
  mNext[Node1]    = Child;
  mNext[Child]    = Node2;
  mPrev[Node2]    = Child;
  mPrev[Child]    = Node1;
  mParent[Child]  = Parent;
  mChildCount[Parent]++;
}